

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

void __thiscall
VPLGrammar::Parser::CompoundStatementNode::BuildProgram
          (CompoundStatementNode *this,Scope *scope,ostream *out)

{
  pointer puVar1;
  ASTNodeBasic *pAVar2;
  pointer pNVar3;
  unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> *child;
  pointer puVar4;
  
  std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::emplace_back<>(&scope->scopes_);
  puVar1 = (this->super_ASTNodeBasic).children_.
           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->super_ASTNodeBasic).children_.
                super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pAVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
             ._M_t.
             super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
             .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl;
    (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
  }
  pNVar3 = (scope->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (scope->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar3 + -1;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&pNVar3[-1].offsets_._M_h);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                scope->OpenScope();
                for (const auto& child : children_) {
                    child->BuildProgram(scope, out);
                }
                scope->CloseScope();
            }